

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seq.c
# Opt level: O3

void * coll_seq_insert_at(coll_seq_t *seq,void *data,size_t index)

{
  ulong uVar1;
  void *pvVar2;
  coll_seq_node_t *pcVar3;
  coll_seq_t *pcVar4;
  coll_seq_node_t *pcVar5;
  coll_seq_node_t *pcVar6;
  
  if (seq != (coll_seq_t *)0x0) {
    uVar1 = seq->len;
    if (index <= uVar1) {
      if (uVar1 != index) {
        pcVar5 = seq->head;
        if (index == 0) {
          pcVar6 = (coll_seq_node_t *)0x0;
        }
        else {
          do {
            pcVar6 = pcVar5;
            pcVar5 = pcVar6->next;
            index = index - 1;
          } while (index != 0);
        }
        pcVar3 = (coll_seq_node_t *)malloc(0x10);
        pcVar3->data = data;
        pcVar4 = (coll_seq_t *)&pcVar6->next;
        if (pcVar6 == (coll_seq_node_t *)0x0) {
          pcVar4 = seq;
        }
        pcVar3->next = pcVar5;
        pcVar4->head = pcVar3;
        seq->len = uVar1 + 1;
        return data;
      }
      pvVar2 = coll_seq_append(seq,data);
      return pvVar2;
    }
  }
  return (void *)0x0;
}

Assistant:

void *coll_seq_insert_at(coll_seq_t *seq, void *data, size_t index) {
    if (!seq || index > seq->len) {
        return NULL;
    } else if (index == seq->len) {
        return coll_seq_append(seq, data);
    }
    node_t *prev = NULL, *cur = seq->head;
    for (size_t i = 0; i < index; ++i) {
        prev = cur;
        cur = cur->next;
    }
    node_t *node = malloc(sizeof(node_t));
    node->data = data;
    node->next = cur;
    if (prev) {
        prev->next = node;
    } else {
        seq->head = node;
    }
    ++(seq->len);
    return data;
}